

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

int __thiscall
TSMuxer::writeTSFrames
          (TSMuxer *this,int pid,uint8_t *buffer,int64_t len,bool priorityData,bool payloadStart)

{
  uint uVar1;
  int iVar2;
  mapped_type *pmVar3;
  longlong pcr;
  ostream *poVar4;
  size_t sVar5;
  uint8_t *puVar6;
  TSPacket *this_00;
  size_type sVar7;
  reference pvVar8;
  size_t sStack_78;
  int tsHeaderSize;
  int64_t payloadLen;
  TSPacket *tsPacket;
  uint32_t *initTS;
  int64_t tmpBufferLen;
  longlong newPCR;
  StreamInfo *streamInfo;
  bool tsPriority;
  uint8_t *end;
  uint8_t *curPos;
  int result;
  bool payloadStart_local;
  bool priorityData_local;
  int64_t len_local;
  uint8_t *buffer_local;
  TSMuxer *pTStack_10;
  int pid_local;
  TSMuxer *this_local;
  
  curPos._0_4_ = 0;
  buffer_local._4_4_ = pid;
  pTStack_10 = this;
  pmVar3 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](&this->m_streamInfo,(key_type_conflict *)((long)&buffer_local + 4));
  end = buffer;
  curPos._6_1_ = payloadStart;
  while (end < buffer + len) {
    if ((((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) &&
        (pcr = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                       (double)this->m_cbrBitrate), (long)this->m_pcr_delta <= pcr - this->m_lastPCR
        )) && (this->m_lastPCR != -1)) {
      this->m_pcrBits = 0;
      writePATPMT(this,pcr,false);
      writePCR(this,pcr);
      if ((this->m_lastPESDTS != -1) && (this->m_lastPESDTS < this->m_lastPCR)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"VBV buffer overflow at position ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(double)(this->m_lastPCR - this->m_fixed_pcr_offset) / 90000.0);
        poVar4 = std::operator<<(poVar4," sec");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
    }
    if ((this->m_m2tsMode & 1U) != 0) {
      this->m_outBufLen = this->m_outBufLen + 4;
      this->m_processedBlockSize = this->m_processedBlockSize + 4;
      this->m_pcrBits = this->m_pcrBits + 0x20;
    }
    sVar5 = (long)(buffer + len) - (long)end;
    puVar6 = this->m_outBuf + this->m_outBufLen;
    puVar6[0] = 'G';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\x10';
    this_00 = (TSPacket *)(this->m_outBuf + this->m_outBufLen);
    iVar2 = TSPacket::getHeaderSize(this_00);
    sStack_78 = (size_t)(0xbc - iVar2);
    TSPacket::setPID(this_00,buffer_local._4_4_);
    uVar1 = pmVar3->m_tsCnt;
    pmVar3->m_tsCnt = uVar1 + 1;
    *(uint *)this_00 = *(uint *)this_00 & 0xf0ffffff | (uVar1 & 0xf) << 0x18;
    *(uint *)this_00 = *(uint *)this_00 & 0xffffbfff | (uint)(curPos._6_1_ & 1) << 0xe;
    curPos._6_1_ = 0;
    *(uint *)this_00 = *(uint *)this_00 & 0xffffdfff | (uint)priorityData << 0xd;
    if ((long)sVar5 < (long)sStack_78) {
      if ((*(uint *)this_00 >> 0x1d & 1) == 0) {
        *(uint *)this_00 = *(uint *)this_00 & 0xdfffffff | 0x20000000;
        if (sStack_78 - sVar5 == 1) {
          *(ushort *)&this_00->adaptiveField = *(ushort *)&this_00->adaptiveField & 0xff00;
          sStack_78 = sStack_78 - 1;
        }
        else {
          puVar6[4] = '\x01';
          puVar6[5] = '\0';
          puVar6[6] = '\0';
          puVar6[7] = '\0';
          sStack_78 = sStack_78 - 2;
        }
      }
      iVar2 = TSPacket::getHeaderSize(this_00);
      memset(&this_00->field_0x0 + iVar2,0xff,sStack_78 - sVar5);
      *(ushort *)&this_00->adaptiveField =
           *(ushort *)&this_00->adaptiveField & 0xff00 |
           (*(ushort *)&this_00->adaptiveField & 0xff) + ((short)sStack_78 - (short)sVar5) & 0xff;
      sStack_78 = sVar5;
    }
    iVar2 = TSPacket::getHeaderSize(this_00);
    memcpy(this->m_outBuf + (long)iVar2 + (long)this->m_outBufLen,end,sStack_78);
    end = end + sStack_78;
    this->m_outBufLen = this->m_outBufLen + 0xbc;
    this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
    this->m_pcrBits = this->m_pcrBits + 0x5e0;
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_muxedPacketCnt);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_muxedPacketCnt,sVar7 - 1);
    *pvVar8 = *pvVar8 + 1;
    writeOutBuffer(this);
    curPos._0_4_ = (int)curPos + 1;
  }
  return (int)curPos;
}

Assistant:

int TSMuxer::writeTSFrames(const int pid, const uint8_t* buffer, const int64_t len, const bool priorityData,
                           bool payloadStart)
{
    int result = 0;

    const uint8_t* curPos = buffer;
    const uint8_t* end = buffer + len;

    const bool tsPriority = priorityData;
    StreamInfo& streamInfo = m_streamInfo[pid];

    while (curPos < end)
    {
        if (m_cbrBitrate != -1 && m_lastPCR != -1)
        {
            const auto newPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
            if (newPCR - m_lastPCR >= m_pcr_delta && m_lastPCR != -1)
            {
                m_pcrBits = 0;
                writePATPMT(newPCR);
                writePCR(newPCR);
                if (m_lastPESDTS != -1 && m_lastPCR > m_lastPESDTS)
                {
                    LTRACE(LT_ERROR, 2,
                           "VBV buffer overflow at position " << (double)(m_lastPCR - m_fixed_pcr_offset) / 90000.0
                                                              << " sec");
                }
            }
        }

        if (m_m2tsMode)
        {
            m_outBufLen += 4;
            m_processedBlockSize += 4;
            m_pcrBits += 4 * 8;
        }
        const int64_t tmpBufferLen = end - curPos;
        const auto initTS = reinterpret_cast<uint32_t*>(m_outBuf + m_outBufLen);
        *initTS = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
        int64_t payloadLen = TS_FRAME_SIZE - tsPacket->getHeaderSize();
        tsPacket->setPID(pid);
        tsPacket->counter = streamInfo.m_tsCnt++;
        tsPacket->payloadStart = payloadStart;  // curPos == buffer;
        payloadStart = false;
        tsPacket->priority = tsPriority;
        if (tmpBufferLen < payloadLen)
        {
            // insert padding bytes
            if (!tsPacket->afExists)
            {
                tsPacket->afExists = 1;
                if (payloadLen - tmpBufferLen == 1)
                {
                    tsPacket->adaptiveField.length = 0;
                    payloadLen--;
                }
                else
                {
                    initTS[1] = 0x01;  // zero all af flags, set af len to 1.
                    payloadLen -= 2;
                }
            }
            memset(reinterpret_cast<uint8_t*>(tsPacket) + tsPacket->getHeaderSize(), 0xff, payloadLen - tmpBufferLen);
            tsPacket->adaptiveField.length += static_cast<unsigned>(payloadLen - tmpBufferLen);
            payloadLen = tmpBufferLen;
        }
        const int tsHeaderSize = tsPacket->getHeaderSize();
        memcpy(m_outBuf + m_outBufLen + tsHeaderSize, curPos, payloadLen);

        curPos += payloadLen;
        m_outBufLen += TS_FRAME_SIZE;
        m_processedBlockSize += TS_FRAME_SIZE;
        m_pcrBits += TS_FRAME_SIZE * 8;
        m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
        writeOutBuffer();
        result++;
    }
    return result;
}